

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O2

JsValueRef
WScriptJsrt::ReceiveBroadcastCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  RuntimeThreadLocalData *pRVar2;
  RuntimeThreadData *pRVar3;
  JsValueRef local_28;
  JsValueRef returnValue;
  
  local_28 = (JsValueRef)0x0;
  JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetUndefinedValue)(&local_28);
  if ((1 < argumentCount) && (JVar1 == JsNoError)) {
    pRVar2 = GetRuntimeThreadLocalData();
    pRVar3 = pRVar2->threadData;
    if (pRVar3 != (RuntimeThreadData *)0x0) {
      if (pRVar3->receiveBroadcastCallbackFunc != (JsRef)0x0) {
        (*ChakraRTInterface::m_jsApiHooks.pfJsrtRelease)
                  (pRVar3->receiveBroadcastCallbackFunc,(uint *)0x0);
        pRVar3 = pRVar2->threadData;
      }
      pRVar3->receiveBroadcastCallbackFunc = arguments[1];
      (*ChakraRTInterface::m_jsApiHooks.pfJsrtAddRef)
                (pRVar2->threadData->receiveBroadcastCallbackFunc,(uint *)0x0);
    }
  }
  return local_28;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::ReceiveBroadcastCallback(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;

    IfJsrtErrorSetGo(ChakraRTInterface::JsGetUndefinedValue(&returnValue));

    if (argumentCount > 1)
    {
        auto& threadData = GetRuntimeThreadLocalData().threadData;
        if (threadData)
        {
            if (threadData->receiveBroadcastCallbackFunc)
            {
                ChakraRTInterface::JsRelease(threadData->receiveBroadcastCallbackFunc, nullptr);
            }
            threadData->receiveBroadcastCallbackFunc = arguments[1];
            ChakraRTInterface::JsAddRef(threadData->receiveBroadcastCallbackFunc, nullptr);
        }
    }

Error:
    return returnValue;
}